

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackLog.cxx
# Opt level: O3

bool __thiscall cmCPackLog::SetLogOutputFile(cmCPackLog *this,char *fname)

{
  _func_int **pp_Var1;
  cmGeneratedFileStream *this_00;
  size_t sVar2;
  string local_40;
  
  if (fname != (char *)0x0) {
    this_00 = (cmGeneratedFileStream *)operator_new(0x248);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar2 = strlen(fname);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,fname,fname + sVar2);
    cmGeneratedFileStream::cmGeneratedFileStream(this_00,&local_40,false,None);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    pp_Var1 = (this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream;
    if (((&(this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)pp_Var1[-3]] & 5) == 0) goto LAB_001570d6;
    (*pp_Var1[1])(this_00);
  }
  this_00 = (cmGeneratedFileStream *)0x0;
LAB_001570d6:
  if ((this->LogOutputCleanup == true) && (this->LogOutput != (ostream *)0x0)) {
    (*this->LogOutput->_vptr_basic_ostream[1])();
  }
  this->LogOutputCleanup = false;
  this->LogOutput = (ostream *)this_00;
  if (this_00 != (cmGeneratedFileStream *)0x0) {
    this->LogOutputCleanup = true;
  }
  return this_00 != (cmGeneratedFileStream *)0x0;
}

Assistant:

bool cmCPackLog::SetLogOutputFile(const char* fname)
{
  cmGeneratedFileStream* cg = nullptr;
  if (fname) {
    cg = new cmGeneratedFileStream(fname);
  }
  if (cg && !*cg) {
    delete cg;
    cg = nullptr;
  }
  this->SetLogOutputStream(cg);
  if (!cg) {
    return false;
  }
  this->LogOutputCleanup = true;
  return true;
}